

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

size_t __thiscall
booster::locale::impl_icu::date_format<char>::do_parse<double>
          (date_format<char> *this,string_type *str,double *value)

{
  char_type *begin;
  size_t sVar1;
  double dVar2;
  ParsePosition pp;
  UnicodeString tmp;
  code *local_78;
  undefined8 local_70;
  double local_68;
  icu_std_converter<char,_1> local_60;
  
  local_78 = std::_Rb_tree_increment;
  local_70 = 0xffffffff00000000;
  icu_std_converter<char,_1>::icu(&local_60,(char_type *)&this->cvt_,(str->_M_dataplus)._M_p);
  dVar2 = (double)icu_70::DateFormat::parse
                            ((UnicodeString *)this->icu_fmt_,(ParsePosition *)&local_60);
  if ((long)(int)local_70 != 0) {
    dVar2 = dVar2 / 1000.0;
    sVar1 = 0;
    if ((1.79769313486232e+308 < dVar2) || (dVar2 < 2.2250738585072014e-308)) goto LAB_00185592;
    begin = (str->_M_dataplus)._M_p;
    local_68 = dVar2;
    sVar1 = icu_std_converter<char,_1>::cut
                      (&this->cvt_,(UnicodeString *)&local_60,begin,begin + str->_M_string_length,
                       (long)(int)local_70,0,0);
    if (sVar1 != 0) {
      *value = local_68;
      goto LAB_00185592;
    }
  }
  sVar1 = 0;
LAB_00185592:
  icu_70::UnicodeString::~UnicodeString((UnicodeString *)&local_60);
  icu_70::ParsePosition::~ParsePosition((ParsePosition *)&local_78);
  return sVar1;
}

Assistant:

size_t do_parse(string_type const &str,ValueType &value) const
            {
                icu::ParsePosition pp;
                icu::UnicodeString tmp = cvt_.icu(str.data(),str.data() + str.size());

                UDate udate = icu_fmt_->parse(tmp,pp);
                if(pp.getIndex() == 0)
                    return 0;
                double date = udate / 1000.0;
                typedef std::numeric_limits<ValueType> limits_type;
                if(date > limits_type::max() || date < limits_type::min())
                    return 0;
                size_t cut = cvt_.cut(tmp,str.data(),str.data()+str.size(),pp.getIndex());
                if(cut==0)
                    return 0;
                value=static_cast<ValueType>(date);
                return cut;

            }